

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_java.cpp
# Opt level: O3

string * __thiscall
flatbuffers::java::JavaGenerator::GenConcreteTypeGet_ObjectAPI_abi_cxx11_
          (string *__return_storage_ptr__,JavaGenerator *this,Type *type)

{
  char *pcVar1;
  pointer pcVar2;
  BaseType BVar3;
  long *plVar4;
  EnumDef **ppEVar5;
  string new_type_name;
  Type local_80;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  DestinationType(&local_80,this,type,true);
  GenTypeGet_abi_cxx11_(__return_storage_ptr__,this,&local_80);
  BVar3 = type->base_type;
  if (BVar3 - BASE_TYPE_VECTOR < 2) {
LAB_00234a0f:
    if (type->struct_def == (StructDef *)0x0) {
      if (type->element == BASE_TYPE_UNION) {
        IdlNamer::NamespacedType_abi_cxx11_
                  (&local_60,&this->namer_,&type->enum_def->super_Definition);
        std::operator+(&local_40,&this->package_prefix_,&local_60);
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_40);
        goto LAB_00234afb;
      }
    }
    else {
      pcVar1 = (char *)(type->struct_def->super_Definition).name._M_string_length;
      (*(this->namer_).super_Namer._vptr_Namer[0x11])(&local_80,&this->namer_);
      std::__cxx11::string::replace
                ((ulong)__return_storage_ptr__,
                 __return_storage_ptr__->_M_string_length - (long)pcVar1,pcVar1,local_80._0_8_);
      local_60.field_2._M_allocated_capacity = (size_type)local_80.enum_def;
      local_60._M_dataplus._M_p = (pointer)local_80._0_8_;
      if ((EnumDef **)local_80._0_8_ != &local_80.enum_def) goto LAB_00234b95;
    }
  }
  else {
    if (BVar3 != BASE_TYPE_UNION) {
      if (BVar3 != BASE_TYPE_ARRAY) goto LAB_00234ba0;
      goto LAB_00234a0f;
    }
    IdlNamer::NamespacedType_abi_cxx11_(&local_60,&this->namer_,&type->enum_def->super_Definition);
    std::operator+(&local_40,&this->package_prefix_,&local_60);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_40);
LAB_00234afb:
    ppEVar5 = (EnumDef **)(plVar4 + 2);
    if ((EnumDef **)*plVar4 == ppEVar5) {
      local_80.enum_def = *ppEVar5;
      local_80._24_8_ = plVar4[3];
      local_80._0_8_ = &local_80.enum_def;
    }
    else {
      local_80.enum_def = *ppEVar5;
      local_80._0_8_ = (EnumDef **)*plVar4;
    }
    local_80.struct_def = (StructDef *)plVar4[1];
    *plVar4 = (long)ppEVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_80);
    if ((EnumDef **)local_80._0_8_ != &local_80.enum_def) {
      operator_delete((void *)local_80._0_8_,
                      (ulong)((long)&((local_80.enum_def)->super_Definition).name._M_dataplus._M_p +
                             1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
LAB_00234b95:
      operator_delete(local_60._M_dataplus._M_p,
                      (ulong)((long)&(((EnumDef *)local_60.field_2._M_allocated_capacity)->
                                     super_Definition).name._M_dataplus._M_p + 1));
    }
  }
  BVar3 = type->base_type;
LAB_00234ba0:
  if ((BVar3 == BASE_TYPE_ARRAY) || (BVar3 == BASE_TYPE_VECTOR)) {
    pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p;
    local_80._0_8_ = &local_80.enum_def;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_80,pcVar2,pcVar2 + __return_storage_ptr__->_M_string_length);
    std::__cxx11::string::append((char *)&local_80);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_80);
    if ((EnumDef **)local_80._0_8_ != &local_80.enum_def) {
      operator_delete((void *)local_80._0_8_,
                      (ulong)((long)&((local_80.enum_def)->super_Definition).name._M_dataplus._M_p +
                             1));
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GenConcreteTypeGet_ObjectAPI(
      const flatbuffers::Type &type) const {
    auto type_name = GenTypeNameDest(type);
    // Replace to ObjectBaseAPI Type Name
    switch (type.base_type) {
      case BASE_TYPE_STRUCT: FLATBUFFERS_FALLTHROUGH();  // fall thru
      case BASE_TYPE_ARRAY: FLATBUFFERS_FALLTHROUGH();   // fall thru
      case BASE_TYPE_VECTOR: {
        if (type.struct_def != nullptr) {
          auto type_name_length = type.struct_def->name.length();
          auto new_type_name = namer_.ObjectType(*type.struct_def);
          type_name.replace(type_name.length() - type_name_length,
                            type_name_length, new_type_name);
        } else if (type.element == BASE_TYPE_UNION) {
          type_name = Prefixed(namer_.NamespacedType(*type.enum_def)) + "Union";
        }
        break;
      }

      case BASE_TYPE_UNION: {
        type_name = Prefixed(namer_.NamespacedType(*type.enum_def)) + "Union";
        break;
      }
      default: break;
    }

    switch (type.base_type) {
      case BASE_TYPE_ARRAY: FLATBUFFERS_FALLTHROUGH();  // fall thru
      case BASE_TYPE_VECTOR: {
        type_name = type_name + "[]";
        break;
      }
      default: break;
    }
    return type_name;
  }